

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

int nn_socket(int domain,int protocol)

{
  ushort uVar1;
  FILE *__stream;
  int iVar2;
  long lVar3;
  char *pcVar4;
  nn_sock **ppnVar5;
  nn_list_item *it;
  nn_list_item *pnVar6;
  nn_sock *self;
  int *piVar7;
  uint *puVar8;
  short sVar9;
  undefined8 uVar10;
  nn_socktype *socktype;
  uint local_34;
  
  nn_glock_lock();
  if ((::self.flags & 1U) == 0) {
    if (::self.socks == (nn_sock **)0x0) {
      nn_alloc_init();
      nn_random_seed();
      ::self.socks = (nn_sock **)nn_alloc_(0x1400);
      if (::self.socks == (nn_sock **)0x0) {
        uVar10 = 0xcd;
LAB_001109df:
        fprintf(_stderr,"Out of memory (%s:%d)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/global.c"
                ,uVar10);
LAB_001109e9:
        fflush(_stderr);
        nn_err_abort();
      }
      for (lVar3 = 0; lVar3 != 0x200; lVar3 = lVar3 + 1) {
        ::self.socks[lVar3] = (nn_sock *)0x0;
      }
      ::self.nsocks = 0;
      ::self.flags = 0;
      pcVar4 = getenv("NN_PRINT_ERRORS");
      ::self.print_errors = 0;
      if (pcVar4 != (char *)0x0) {
        ::self.print_errors = (int)(*pcVar4 != '\0');
      }
      ppnVar5 = ::self.socks + 0x200;
      sVar9 = 0x1ff;
      ::self.unused = (uint16_t *)ppnVar5;
      for (lVar3 = 0; lVar3 != 0x200; lVar3 = lVar3 + 1) {
        *(short *)((long)ppnVar5 + lVar3 * 2) = sVar9;
        sVar9 = sVar9 + -1;
      }
      nn_list_init(&::self.transports);
      nn_list_init(&::self.socktypes);
      nn_global_add_transport(nn_inproc);
      nn_global_add_transport(nn_ipc);
      nn_global_add_transport(nn_tcp);
      nn_global_add_transport(nn_ws);
      nn_global_add_socktype(nn_pair_socktype);
      nn_global_add_socktype(nn_xpair_socktype);
      nn_global_add_socktype(nn_pub_socktype);
      nn_global_add_socktype(nn_sub_socktype);
      nn_global_add_socktype(nn_xpub_socktype);
      nn_global_add_socktype(nn_xsub_socktype);
      nn_global_add_socktype(nn_rep_socktype);
      nn_global_add_socktype(nn_req_socktype);
      nn_global_add_socktype(nn_xrep_socktype);
      nn_global_add_socktype(nn_xreq_socktype);
      nn_global_add_socktype(nn_push_socktype);
      nn_global_add_socktype(nn_xpush_socktype);
      nn_global_add_socktype(nn_pull_socktype);
      nn_global_add_socktype(nn_xpull_socktype);
      nn_global_add_socktype(nn_respondent_socktype);
      nn_global_add_socktype(nn_surveyor_socktype);
      nn_global_add_socktype(nn_xrespondent_socktype);
      nn_global_add_socktype(nn_xsurveyor_socktype);
      nn_global_add_socktype(nn_bus_socktype);
      nn_global_add_socktype(nn_xbus_socktype);
      iVar2 = nn_setup_atfork_handlers();
      __stream = _stderr;
      if (iVar2 != 0) {
        puVar8 = (uint *)__errno_location();
        pcVar4 = nn_err_strerror(*puVar8);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar4,(ulong)*puVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/global.c"
                ,0x100);
        goto LAB_001109e9;
      }
      nn_pool_init(&::self.pool);
    }
    if (domain - 3U < 0xfffffffe) {
      iVar2 = -0x61;
    }
    else if (::self.nsocks < 0x200) {
      uVar1 = *(ushort *)((long)::self.unused + (ulong)(uint)((0x1ff - (int)::self.nsocks) * 2));
      it = nn_list_begin(&::self.socktypes);
      iVar2 = -0x16;
      for (; pnVar6 = nn_list_end(&::self.socktypes), it != pnVar6;
          it = nn_list_next(&::self.socktypes,it)) {
        socktype = (nn_socktype *)(it + -2);
        if (it == (nn_list_item *)0x0) {
          socktype = (nn_socktype *)0x0;
        }
        if ((socktype->domain == domain) && (socktype->protocol == protocol)) {
          self = (nn_sock *)nn_alloc_(0x250);
          if (self == (nn_sock *)0x0) {
            uVar10 = 0x1b3;
            goto LAB_001109df;
          }
          local_34 = (uint)uVar1;
          iVar2 = nn_sock_init(self,socktype,local_34);
          if (-1 < iVar2) {
            ::self.socks[local_34] = self;
            ::self.nsocks = ::self.nsocks + 1;
            nn_glock_unlock();
            return local_34;
          }
          break;
        }
      }
    }
    else {
      iVar2 = -0x18;
    }
    nn_global_term();
    nn_glock_unlock();
    piVar7 = __errno_location();
    *piVar7 = -iVar2;
  }
  else {
    nn_glock_unlock();
    piVar7 = __errno_location();
    *piVar7 = 0x9523dfd;
  }
  return -1;
}

Assistant:

int nn_socket (int domain, int protocol)
{
    int rc;

    nn_glock_lock ();

    /*  If nn_term() was already called, return ETERM. */
    if (nn_slow (self.flags & NN_CTX_FLAG_ZOMBIE)) {
        nn_glock_unlock ();
        errno = ETERM;
        return -1;
    }

    /*  Make sure that global state is initialised. */
    nn_global_init ();

    rc = nn_global_create_socket (domain, protocol);

    if (rc < 0) {
        nn_global_term ();
        nn_glock_unlock ();
        errno = -rc;
        return -1;
    }

    nn_glock_unlock();

    return rc;
}